

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseExprList(WastParser *this,ExprList *exprs)

{
  bool bVar1;
  Result RVar2;
  Enum EVar3;
  __off64_t *in_R8;
  size_t in_R9;
  Expr *pEVar4;
  ExprList new_exprs;
  
  pEVar4 = (Expr *)0x0;
  EVar3 = Error;
  do {
    while( true ) {
      bVar1 = PeekMatchExpr(this);
      if (!bVar1) {
        EVar3 = Ok;
        goto LAB_00dab9e8;
      }
      RVar2 = ParseExpr(this,(ExprList *)&stack0xffffffffffffffb8);
      if (RVar2.enum_ != Ok) break;
      intrusive_list<wabt::Expr>::splice
                (exprs,(int)exprs,(__off64_t *)0x0,(int)(ExprList *)&stack0xffffffffffffffb8,in_R8,
                 in_R9,(uint)pEVar4);
    }
    RVar2 = Synchronize(this,anon_unknown_1::IsExpr);
  } while (RVar2.enum_ != Error);
LAB_00dab9e8:
  intrusive_list<wabt::Expr>::clear((intrusive_list<wabt::Expr> *)&stack0xffffffffffffffb8);
  return (Result)EVar3;
}

Assistant:

Result WastParser::ParseExprList(ExprList* exprs) {
  WABT_TRACE(ParseExprList);
  ExprList new_exprs;
  while (PeekMatchExpr()) {
    if (Succeeded(ParseExpr(&new_exprs))) {
      exprs->splice(exprs->end(), new_exprs);
    } else {
      CHECK_RESULT(Synchronize(IsExpr));
    }
  }
  return Result::Ok;
}